

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O2

void __thiscall pmx::PmxModel::Read(PmxModel *this,istream *stream)

{
  PmxSetting *this_00;
  float fVar1;
  _Alloc_hider _Var2;
  int iVar3;
  ostream *poVar4;
  DeadlyImportError *pDVar5;
  int *in_RCX;
  int i_1;
  long lVar6;
  int i;
  long lVar7;
  int i_2;
  int i_8;
  string local_80;
  int *local_60;
  char magic [4];
  string local_50;
  
  std::istream::read((char *)stream,(long)magic);
  if (magic != (char  [4])0x20584d50) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"invalid magic number.");
    std::endl<char,std::char_traits<char>>(poVar4);
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_80,"MMD: invalid magic number.",(allocator *)&local_50);
    DeadlyImportError::DeadlyImportError(pDVar5,&local_80);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::read((char *)stream,(long)this);
  fVar1 = this->version;
  if (((fVar1 != 2.0) || (NAN(fVar1))) && ((fVar1 != 2.1 || (NAN(fVar1))))) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"this is not ver2.0 or ver2.1 but ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->version);
    poVar4 = std::operator<<(poVar4,".");
    std::endl<char,std::char_traits<char>>(poVar4);
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    to_string<float>(&local_50,this->version);
    std::operator+(&local_80,"MMD: this is not ver2.0 or ver2.1 but ",&local_50);
    DeadlyImportError::DeadlyImportError(pDVar5,&local_80);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = &this->setting;
  PmxSetting::Read(this_00,stream);
  ReadString_abi_cxx11_
            (&local_80,(pmx *)stream,(istream *)(ulong)(this->setting).encoding,(uint8_t)in_RCX);
  std::__cxx11::string::operator=((string *)&this->model_name,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  ReadString_abi_cxx11_
            (&local_80,(pmx *)stream,(istream *)(ulong)(this->setting).encoding,(uint8_t)in_RCX);
  std::__cxx11::string::operator=((string *)&this->model_english_name,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  ReadString_abi_cxx11_
            (&local_80,(pmx *)stream,(istream *)(ulong)(this->setting).encoding,(uint8_t)in_RCX);
  std::__cxx11::string::operator=((string *)&this->model_comment,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  ReadString_abi_cxx11_
            (&local_80,(pmx *)stream,(istream *)(ulong)(this->setting).encoding,(uint8_t)in_RCX);
  std::__cxx11::string::operator=((string *)&this->model_english_comment,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::istream::read((char *)stream,(long)&this->vertex_count);
  mmd::make_unique<pmx::PmxVertex[]>((mmd *)&local_80,(long)this->vertex_count);
  _Var2._M_p = local_80._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_> *)
             &this->vertices,(pointer)_Var2._M_p);
  std::unique_ptr<pmx::PmxVertex[],_std::default_delete<pmx::PmxVertex[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxVertex[],_std::default_delete<pmx::PmxVertex[]>_> *)&local_80);
  lVar6 = 0;
  for (lVar7 = 0; lVar7 < this->vertex_count; lVar7 = lVar7 + 1) {
    PmxVertex::Read((PmxVertex *)
                    ((long)((this->vertices)._M_t.
                            super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>
                            .super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl)->position
                    + lVar6),stream,this_00);
    lVar6 = lVar6 + 0x78;
  }
  std::istream::read((char *)stream,(long)&this->index_count);
  mmd::make_unique<int[]>((mmd *)&local_80,(long)this->index_count);
  _Var2._M_p = local_80._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<int,_std::default_delete<int[]>_>::reset
            ((__uniq_ptr_impl<int,_std::default_delete<int[]>_> *)&this->indices,(pointer)_Var2._M_p
            );
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)&local_80);
  for (lVar6 = 0; lVar6 < this->index_count; lVar6 = lVar6 + 1) {
    iVar3 = ReadIndex(stream,(uint)(this->setting).vertex_index_size);
    in_RCX = (this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    in_RCX[lVar6] = iVar3;
  }
  local_60 = &this->texture_count;
  std::istream::read((char *)stream,(long)local_60);
  mmd::make_unique<std::__cxx11::string[]>((mmd *)&local_80,(long)this->texture_count);
  _Var2._M_p = local_80._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)0x0;
  std::
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
  ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
           *)&this->textures,(pointer)_Var2._M_p);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
                 *)&local_80);
  lVar6 = 0;
  for (lVar7 = 0; lVar7 < *local_60; lVar7 = lVar7 + 1) {
    ReadString_abi_cxx11_
              (&local_80,(pmx *)stream,(istream *)(ulong)this_00->encoding,(uint8_t)in_RCX);
    std::__cxx11::string::operator=
              ((string *)
               ((long)&(((this->textures)._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl)->_M_dataplus)._M_p + lVar6),(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    lVar6 = lVar6 + 0x20;
  }
  std::istream::read((char *)stream,(long)&this->material_count);
  mmd::make_unique<pmx::PmxMaterial[]>((mmd *)&local_80,(long)this->material_count);
  _Var2._M_p = local_80._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_> *)
             &this->materials,(pointer)_Var2._M_p);
  std::unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_> *)&local_80);
  lVar6 = 0;
  for (lVar7 = 0; lVar7 < this->material_count; lVar7 = lVar7 + 1) {
    PmxMaterial::Read((PmxMaterial *)
                      ((long)((this->materials)._M_t.
                              super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>
                              .super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl)->
                             diffuse + lVar6 + -0x40),stream,this_00);
    lVar6 = lVar6 + 0xc0;
  }
  std::istream::read((char *)stream,(long)&this->bone_count);
  mmd::make_unique<pmx::PmxBone[]>((mmd *)&local_80,(long)this->bone_count);
  _Var2._M_p = local_80._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_> *)&this->bones,
             (pointer)_Var2._M_p);
  std::unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_> *)&local_80);
  lVar6 = 0;
  for (lVar7 = 0; lVar7 < this->bone_count; lVar7 = lVar7 + 1) {
    PmxBone::Read((PmxBone *)
                  ((long)((this->bones)._M_t.
                          super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>
                          .super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl)->position +
                  lVar6 + -0x40),stream,this_00);
    lVar6 = lVar6 + 0xb0;
  }
  std::istream::read((char *)stream,(long)&this->morph_count);
  mmd::make_unique<pmx::PmxMorph[]>((mmd *)&local_80,(long)this->morph_count);
  _Var2._M_p = local_80._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_> *)&this->morphs,
             (pointer)_Var2._M_p);
  std::unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_> *)&local_80);
  lVar6 = 0;
  for (lVar7 = 0; lVar7 < this->morph_count; lVar7 = lVar7 + 1) {
    PmxMorph::Read((PmxMorph *)
                   ((long)&(((this->morphs)._M_t.
                             super___uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_pmx::PmxMorph_*,_std::default_delete<pmx::PmxMorph[]>_>
                             .super__Head_base<0UL,_pmx::PmxMorph_*,_false>._M_head_impl)->
                           morph_name)._M_dataplus + lVar6),stream,this_00);
    lVar6 = lVar6 + 0x80;
  }
  std::istream::read((char *)stream,(long)&this->frame_count);
  mmd::make_unique<pmx::PmxFrame[]>((mmd *)&local_80,(long)this->frame_count);
  _Var2._M_p = local_80._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_> *)&this->frames,
             (pointer)_Var2._M_p);
  std::unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_> *)&local_80);
  lVar6 = 0;
  for (lVar7 = 0; lVar7 < this->frame_count; lVar7 = lVar7 + 1) {
    PmxFrame::Read((PmxFrame *)
                   ((long)&(((this->frames)._M_t.
                             super___uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_pmx::PmxFrame_*,_std::default_delete<pmx::PmxFrame[]>_>
                             .super__Head_base<0UL,_pmx::PmxFrame_*,_false>._M_head_impl)->
                           frame_name)._M_dataplus + lVar6),stream,this_00);
    lVar6 = lVar6 + 0x50;
  }
  std::istream::read((char *)stream,(long)&this->rigid_body_count);
  mmd::make_unique<pmx::PmxRigidBody[]>((mmd *)&local_80,(long)this->rigid_body_count);
  _Var2._M_p = local_80._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_> *)
             &this->rigid_bodies,(pointer)_Var2._M_p);
  std::unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_> *)&local_80
            );
  lVar6 = 0;
  for (lVar7 = 0; lVar7 < this->rigid_body_count; lVar7 = lVar7 + 1) {
    PmxRigidBody::Read((PmxRigidBody *)
                       ((long)((this->rigid_bodies)._M_t.
                               super___uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pmx::PmxRigidBody_*,_std::default_delete<pmx::PmxRigidBody[]>_>
                               .super__Head_base<0UL,_pmx::PmxRigidBody_*,_false>._M_head_impl)->
                              size + lVar6 + -0x4c),stream,this_00);
    lVar6 = lVar6 + 0x88;
  }
  std::istream::read((char *)stream,(long)&this->joint_count);
  mmd::make_unique<pmx::PmxJoint[]>((mmd *)&local_80,(long)this->joint_count);
  _Var2._M_p = local_80._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_> *)&this->joints,
             (pointer)_Var2._M_p);
  std::unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_> *)&local_80);
  lVar6 = 0;
  for (lVar7 = 0; lVar7 < this->joint_count; lVar7 = lVar7 + 1) {
    PmxJoint::Read((PmxJoint *)
                   ((long)(((this->joints)._M_t.
                            super___uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pmx::PmxJoint_*,_std::default_delete<pmx::PmxJoint[]>_>
                            .super__Head_base<0UL,_pmx::PmxJoint_*,_false>._M_head_impl)->param).
                          position + lVar6 + 0xffffffffffffffb4U),stream,this_00);
    lVar6 = lVar6 + 0xb0;
  }
  return;
}

Assistant:

void PmxModel::Read(std::istream *stream)
	{
		char magic[4];
		stream->read((char*) magic, sizeof(char) * 4);
		if (magic[0] != 0x50 || magic[1] != 0x4d || magic[2] != 0x58 || magic[3] != 0x20)
		{
			std::cerr << "invalid magic number." << std::endl;
      throw DeadlyImportError("MMD: invalid magic number.");
    }
		stream->read((char*) &version, sizeof(float));
		if (version != 2.0f && version != 2.1f)
		{
			std::cerr << "this is not ver2.0 or ver2.1 but " << version << "." << std::endl;
            throw DeadlyImportError("MMD: this is not ver2.0 or ver2.1 but " + to_string(version));
    }
		this->setting.Read(stream);

		this->model_name = ReadString(stream, setting.encoding);
		this->model_english_name = ReadString(stream, setting.encoding);
		this->model_comment = ReadString(stream, setting.encoding);
		this->model_english_comment = ReadString(stream, setting.encoding);

		// read vertices
		stream->read((char*) &vertex_count, sizeof(int));
		this->vertices = mmd::make_unique<PmxVertex []>(vertex_count);
		for (int i = 0; i < vertex_count; i++)
		{
			vertices[i].Read(stream, &setting);
		}

		// read indices
		stream->read((char*) &index_count, sizeof(int));
		this->indices = mmd::make_unique<int []>(index_count);
		for (int i = 0; i < index_count; i++)
		{
			this->indices[i] = ReadIndex(stream, setting.vertex_index_size);
		}

		// read texture names
		stream->read((char*) &texture_count, sizeof(int));
		this->textures = mmd::make_unique<std::string []>(texture_count);
		for (int i = 0; i < texture_count; i++)
		{
			this->textures[i] = ReadString(stream, setting.encoding);
		}

		// read materials
		stream->read((char*) &material_count, sizeof(int));
		this->materials = mmd::make_unique<PmxMaterial []>(material_count);
		for (int i = 0; i < material_count; i++)
		{
			this->materials[i].Read(stream, &setting);
		}

		// read bones
		stream->read((char*) &this->bone_count, sizeof(int));
		this->bones = mmd::make_unique<PmxBone []>(this->bone_count);
		for (int i = 0; i < this->bone_count; i++)
		{
			this->bones[i].Read(stream, &setting);
		}

		// read morphs
		stream->read((char*) &this->morph_count, sizeof(int));
		this->morphs = mmd::make_unique<PmxMorph []>(this->morph_count);
		for (int i = 0; i < this->morph_count; i++)
		{
			this->morphs[i].Read(stream, &setting);
		}

		// read display frames
		stream->read((char*) &this->frame_count, sizeof(int));
		this->frames = mmd::make_unique<PmxFrame []>(this->frame_count);
		for (int i = 0; i < this->frame_count; i++)
		{
			this->frames[i].Read(stream, &setting);
		}

		// read rigid bodies
		stream->read((char*) &this->rigid_body_count, sizeof(int));
		this->rigid_bodies = mmd::make_unique<PmxRigidBody []>(this->rigid_body_count);
		for (int i = 0; i < this->rigid_body_count; i++)
		{
			this->rigid_bodies[i].Read(stream, &setting);
		}

		// read joints
		stream->read((char*) &this->joint_count, sizeof(int));
		this->joints = mmd::make_unique<PmxJoint []>(this->joint_count);
		for (int i = 0; i < this->joint_count; i++)
		{
			this->joints[i].Read(stream, &setting);
		}
	}